

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlSubstitutionItem::DebugXmlLhs
          (GdlSubstitutionItem *this,GrcManager *param_1,ofstream *strmOut,string *param_3)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)strmOut,"          <lhsSlot className=\"");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_
            (&sStack_38,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_psymInput);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  poVar1 = std::operator<<(poVar1,"\" slotIndex=\"");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_iritContextPos + 1);
  std::operator<<(poVar1,"\" />\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void GdlSubstitutionItem::DebugXmlLhs(GrcManager * /*pcman*/, std::ofstream & strmOut,
	std::string /*staPathToCur*/)
{
	strmOut << "          <lhsSlot className=\"" << m_psymInput->FullAbbrev()
		<< "\" slotIndex=\"" << m_iritContextPos + 1 << "\" />\n";
}